

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O3

bool __thiscall
chrono::ChIterativeSolverLS::Setup(ChIterativeSolverLS *this,ChSystemDescriptor *sysd)

{
  double dVar1;
  ChMatrixSPMV *pCVar2;
  ulong uVar3;
  double *pdVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong size;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar7 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar8 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  pCVar2 = this->m_spmv;
  size = (ulong)(iVar8 + iVar7);
  pCVar2->m_N = size;
  pCVar2->m_sysd = sysd;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(pCVar2->m_vect).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,size);
  if ((this->super_ChIterativeSolver).m_use_precond == true) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->m_invdiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               size);
    (*sysd->_vptr_ChSystemDescriptor[0xf])(sysd,&this->m_invdiag);
    if (0 < iVar8 + iVar7) {
      auVar10._8_8_ = 0x7fffffffffffffff;
      auVar10._0_8_ = 0x7fffffffffffffff;
      uVar3 = (this->m_invdiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      pdVar4 = (this->m_invdiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar9 = 0;
      do {
        if ((~((long)uVar3 >> 0x3f) & uVar3) == uVar9) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar1 = pdVar4[uVar9];
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar1;
        auVar11 = vandpd_avx(auVar11,auVar10);
        uVar5 = vcmpsd_avx512f(auVar11,ZEXT816(0x3e112e0be826d695),0xe);
        bVar6 = (bool)((byte)uVar5 & 1);
        pdVar4[uVar9] =
             (double)((ulong)bVar6 * (long)(1.0 / dVar1) + (ulong)!bVar6 * 0x3ff0000000000000);
        uVar9 = uVar9 + 1;
      } while (size != uVar9);
    }
  }
  if ((this->super_ChIterativeSolver).m_warm_start == true) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->m_initguess).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               size);
    (*sysd->_vptr_ChSystemDescriptor[0x14])(sysd,&this->m_initguess,1);
  }
  iVar7 = (*(this->super_ChIterativeSolver)._vptr_ChIterativeSolver[7])(this);
  return SUB41(iVar7,0);
}

Assistant:

bool ChIterativeSolverLS::Setup(ChSystemDescriptor& sysd) {
    // Calculate problem size
    int dim = sysd.CountActiveVariables() + sysd.CountActiveConstraints();

    // Set up the SPMV wrapper
    m_spmv->Setup(dim, sysd);

    // If needed, evaluate the inverse diagonal entries
    if (m_use_precond) {
        m_invdiag.resize(dim);
        sysd.BuildDiagonalVector(m_invdiag);
        for (int i = 0; i < dim; i++) {
            if (std::abs(m_invdiag(i)) > 1e-9)
                m_invdiag(i) = 1.0 / m_invdiag(i);
            else
                m_invdiag(i) = 1.0;
        }
    }

    // If needed, evaluate the initial guess
    if (m_warm_start) {
        m_initguess.resize(dim);
        sysd.FromUnknownsToVector(m_initguess);
    }

    // Let the concrete solver initialize itself
    bool result = SetupProblem();

    //// ---- DEBUGGING
    ////SaveMatrix(sysd);
    //// ---- DEBUGGING

    return result;
}